

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state_table.cpp
# Opt level: O2

void state_machine::show_string(char *s,int _pos)

{
  ostream *poVar1;
  int iVar2;
  
  poVar1 = std::operator<<((ostream *)&std::cout,s);
  std::endl<char,std::char_traits<char>>(poVar1);
  iVar2 = 0;
  if (0 < _pos) {
    iVar2 = _pos;
  }
  while (iVar2 != 0) {
    std::operator<<((ostream *)&std::cout," ");
    iVar2 = iVar2 + -1;
  }
  poVar1 = std::operator<<((ostream *)&std::cout,'^');
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"pos: ");
  std::ostream::operator<<((ostream *)poVar1,_pos);
  return;
}

Assistant:

void show_string(const char* s, int _pos) {
        std::cout << s << std::endl;
        for (int i = 0; i < _pos; i++) {
            std::cout << " ";
        }
        std::cout << '^' << std::endl;
        std::cout << "pos: " << _pos;
    }